

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitForInOrForOf(ParseNodeForInOrForOf *loopNode,ByteCodeGenerator *byteCodeGenerator,
                     FuncInfo *funcInfo,BOOL fReturnValue)

{
  ByteCodeWriter *this;
  undefined1 *puVar1;
  OpCode OVar2;
  RegSlot R0;
  RegSlot R0_00;
  Scope *pSVar3;
  code *pcVar4;
  bool bVar5;
  ByteCodeLabel loopEntrance;
  ByteCodeLabel labelID;
  ByteCodeLabel BVar6;
  RegSlot R2;
  RegSlot methodReg;
  RegSlot RVar7;
  RegSlot RVar8;
  ByteCodeLabel labelID_00;
  uint loopId;
  undefined4 *puVar9;
  Symbol *pSVar10;
  FuncInfo *pFVar11;
  FuncInfo *funcInfo_00;
  OpCode tryOp;
  RegSlot local_34;
  
  OVar2 = (loopNode->super_ParseNodeStmt).super_ParseNode.nop;
  if (2 < (byte)(OVar2 + ~knopDoWhile)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x266f,"(isForAwaitOf || isForIn || loopNode->nop == knopForOf)",
                       "isForAwaitOf || isForIn || loopNode->nop == knopForOf");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  BeginEmitBlock(loopNode->pnodeBlock,byteCodeGenerator,funcInfo);
  ByteCodeGenerator::StartStatement(byteCodeGenerator,(ParseNode *)loopNode);
  if (OVar2 != knopForIn) {
    FuncInfo::AcquireLoc(funcInfo,(ParseNode *)loopNode);
  }
  this = &byteCodeGenerator->m_writer;
  Js::ByteCodeWriter::RecordStatementAdjustment(this,SAT_All);
  bVar5 = ParseNodeBlock::HasBlockScopedContent(loopNode->pnodeBlock);
  if (bVar5) {
    Js::ByteCodeWriter::RecordForInOrOfCollectionScope(this);
  }
  loopEntrance = Js::ByteCodeWriter::DefineLabel(this);
  labelID = Js::ByteCodeWriter::DefineLabel(this);
  if (loopNode->pnodeLval->nop == knopVarDecl) {
    EmitReference(loopNode->pnodeLval,byteCodeGenerator,funcInfo);
  }
  Emit(loopNode->pnodeObj,byteCodeGenerator,funcInfo,0,false,false);
  FuncInfo::ReleaseLoc(funcInfo,loopNode->pnodeObj);
  EndEmitBlock(loopNode->pnodeBlock,byteCodeGenerator,funcInfo_00);
  pSVar3 = loopNode->pnodeBlock->scope;
  if (pSVar3 != (Scope *)0x0) {
    pSVar10 = pSVar3->m_symList;
    while (pSVar10 != (Symbol *)0x0) {
      pSVar10->field_0x43 = pSVar10->field_0x43 & 0xdf;
      pSVar10 = pSVar10->next;
    }
  }
  if (OVar2 == knopForIn) {
    EmitForIn(loopNode,loopEntrance,labelID,byteCodeGenerator,funcInfo,fReturnValue);
    return;
  }
  BVar6 = Js::ByteCodeWriter::DefineLabel(this);
  Js::ByteCodeWriter::BrReg2
            (this,BrNeq_A,BVar6,loopNode->pnodeObj->location,funcInfo->undefinedConstantRegister);
  Js::ByteCodeWriter::W1(this,RuntimeTypeError,0x1610);
  Js::ByteCodeWriter::MarkLabel(this,BVar6);
  R0 = loopNode->shouldCallReturnFunctionLocation;
  R0_00 = loopNode->shouldCallReturnFunctionLocationFinally;
  bVar5 = Js::FunctionProxy::IsCoroutine(&funcInfo->byteCodeFunction->super_FunctionProxy);
  if (bVar5) {
    local_34 = FuncInfo::AcquireTmpRegister(funcInfo);
    R2 = FuncInfo::AcquireTmpRegister(funcInfo);
  }
  else {
    R2 = 0xffffffff;
    local_34 = 0xffffffff;
  }
  methodReg = FuncInfo::AcquireTmpRegister(funcInfo);
  RVar7 = FuncInfo::AcquireTmpRegister(funcInfo);
  loopNode->itemLocation = RVar7;
  ByteCodeGenerator::SetHasFinally(byteCodeGenerator,true);
  ByteCodeGenerator::SetHasTry(byteCodeGenerator,true);
  pFVar11 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  puVar1 = &(pFVar11->byteCodeFunction->super_FunctionProxy).field_0x47;
  *puVar1 = *puVar1 | 8;
  RVar8 = FuncInfo::AcquireTmpRegister(funcInfo);
  Js::ByteCodeWriter::Reg2(this,Conv_Obj,RVar8,loopNode->pnodeObj->location);
  RVar7 = (loopNode->super_ParseNodeStmt).super_ParseNode.location;
  if (OVar2 == knopForAwaitOf) {
    EmitGetAsyncIterator(RVar7,RVar8,byteCodeGenerator,funcInfo);
  }
  else {
    EmitGetIterator(RVar7,RVar8,byteCodeGenerator,funcInfo);
  }
  FuncInfo::ReleaseTmpRegister(funcInfo,RVar8);
  EmitGetObjectMethod(methodReg,(loopNode->super_ParseNodeStmt).super_ParseNode.location,0x107,
                      byteCodeGenerator,funcInfo);
  BVar6 = Js::ByteCodeWriter::DefineLabel(this);
  labelID_00 = Js::ByteCodeWriter::DefineLabel(this);
  Js::ByteCodeWriter::RecordCrossFrameEntryExitRecord(this,true);
  Js::ByteCodeWriter::Reg1(this,LdFalse,R0);
  Js::ByteCodeWriter::Reg1(this,LdFalse,R0_00);
  if (bVar5) {
    Js::ByteCodeWriter::BrReg2(this,TryFinallyWithYield,BVar6,local_34,R2);
    tryOp = TryFinallyWithYield;
    RVar7 = local_34;
    RVar8 = R2;
  }
  else {
    Js::ByteCodeWriter::Br(this,TryFinally,BVar6);
    RVar7 = 0xffffffff;
    tryOp = TryFinally;
    RVar8 = RVar7;
  }
  ByteCodeGenerator::PushJumpCleanupForTry(byteCodeGenerator,tryOp,BVar6,RVar7,RVar8);
  Js::ByteCodeWriter::Br(this,TryCatch,labelID_00);
  ByteCodeGenerator::PushJumpCleanupForTry
            (byteCodeGenerator,TryCatch,labelID_00,0xffffffff,0xffffffff);
  Js::ByteCodeWriter::EndStatement(this,(ParseNode *)loopNode);
  loopId = Js::ByteCodeWriter::EnterLoop(this,loopEntrance);
  ByteCodeGenerator::PushJumpCleanupForLoop(byteCodeGenerator,(ParseNode *)loopNode,loopId);
  ByteCodeGenerator::StartStatement(byteCodeGenerator,loopNode->pnodeLval);
  Js::ByteCodeWriter::Reg1(this,LdFalse,R0);
  Js::ByteCodeWriter::Reg1(this,LdFalse,R0_00);
  EmitFunctionCall(loopNode->itemLocation,methodReg,
                   (loopNode->super_ParseNodeStmt).super_ParseNode.location,byteCodeGenerator,
                   funcInfo);
  if (OVar2 == knopForAwaitOf) {
    EmitAwait(loopNode->itemLocation,loopNode->itemLocation,byteCodeGenerator,funcInfo);
  }
  EmitThrowOnNotObject(loopNode->itemLocation,byteCodeGenerator);
  RVar7 = FuncInfo::AcquireTmpRegister(funcInfo);
  EmitGetObjectProperty(RVar7,loopNode->itemLocation,0x74,byteCodeGenerator,funcInfo);
  Js::ByteCodeWriter::BrReg1(this,BrTrue_A,labelID,RVar7);
  FuncInfo::ReleaseTmpRegister(funcInfo,RVar7);
  EmitGetObjectProperty
            (loopNode->itemLocation,loopNode->itemLocation,0x197,byteCodeGenerator,funcInfo);
  Js::ByteCodeWriter::Reg1(this,LdTrue,R0);
  Js::ByteCodeWriter::Reg1(this,LdTrue,R0_00);
  EmitForInOfLoopBody(loopNode,loopEntrance,labelID,byteCodeGenerator,funcInfo,fReturnValue);
  ByteCodeGenerator::PopJumpCleanup(byteCodeGenerator);
  Js::ByteCodeWriter::ExitLoop(this,loopId);
  FuncInfo::ReleaseTmpRegister(funcInfo,methodReg);
  EmitIteratorCatchAndFinally
            (labelID_00,BVar6,(loopNode->super_ParseNodeStmt).super_ParseNode.location,R0,R0_00,
             local_34,R2,byteCodeGenerator,funcInfo,OVar2 == knopForAwaitOf);
  return;
}

Assistant:

void EmitForInOrForOf(ParseNodeForInOrForOf *loopNode, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo, BOOL fReturnValue)
{
    bool isForIn = (loopNode->nop == knopForIn);
    bool isForAwaitOf = (loopNode->nop == knopForAwaitOf);
    Assert(isForAwaitOf || isForIn || loopNode->nop == knopForOf);

    BeginEmitBlock(loopNode->pnodeBlock, byteCodeGenerator, funcInfo);

    byteCodeGenerator->StartStatement(loopNode);
    if (!isForIn)
    {
        funcInfo->AcquireLoc(loopNode);
    }

    // Record the branch bytecode offset.
    // This is used for "ignore exception" and "set next stmt" scenarios. See ProbeContainer::GetNextUserStatementOffsetForAdvance:
    // If there is a branch recorded between current offset and next stmt offset, we'll use offset of the branch recorded,
    // otherwise use offset of next stmt.
    // The idea here is that when we bail out after ignore exception, we need to bail out to the beginning of the ForIn,
    // but currently ForIn stmt starts at the condition part, which is needed for correct handling of break point on ForIn
    // (break every time on the loop back edge) and correct display of current statement under debugger.
    // See WinBlue 231880 for details.
    byteCodeGenerator->Writer()->RecordStatementAdjustment(Js::FunctionBody::SAT_All);
    if (loopNode->pnodeBlock->HasBlockScopedContent())
    {
        byteCodeGenerator->Writer()->RecordForInOrOfCollectionScope();
    }
    Js::ByteCodeLabel loopEntrance = byteCodeGenerator->Writer()->DefineLabel();
    Js::ByteCodeLabel continuePastLoop = byteCodeGenerator->Writer()->DefineLabel();

    if (loopNode->pnodeLval->nop == knopVarDecl)
    {
        EmitReference(loopNode->pnodeLval, byteCodeGenerator, funcInfo);
    }

    Emit(loopNode->pnodeObj, byteCodeGenerator, funcInfo, false); // evaluate collection expression
    funcInfo->ReleaseLoc(loopNode->pnodeObj);

    EndEmitBlock(loopNode->pnodeBlock, byteCodeGenerator, funcInfo);
    if (loopNode->pnodeBlock->scope != nullptr)
    {
        loopNode->pnodeBlock->scope->ForEachSymbol([](Symbol *sym) {
            sym->SetIsTrackedForDebugger(false);
        });
    }

    if (isForIn)
    {
        EmitForIn(loopNode, loopEntrance, continuePastLoop, byteCodeGenerator, funcInfo, fReturnValue);
        return;
    }

    Js::ByteCodeLabel skipThrow = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->BrReg2(Js::OpCode::BrNeq_A, skipThrow, loopNode->pnodeObj->location, funcInfo->undefinedConstantRegister);
    byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_ObjectCoercible));
    byteCodeGenerator->Writer()->MarkLabel(skipThrow);

    Js::RegSlot regException = Js::Constants::NoRegister;
    Js::RegSlot regOffset = Js::Constants::NoRegister;

    // These two temp variables track whether the return method of the source iterator should
    // be called. One variable is used for catch block and one is used for finally block.
    // Non-temps are used so that when jitting loop bodies, writes to these variables are not
    // mistaken for dead stores.
    Js::RegSlot shouldCallReturnFunctionLocation = loopNode->shouldCallReturnFunctionLocation;
    Js::RegSlot shouldCallReturnFunctionLocationFinally = loopNode->shouldCallReturnFunctionLocationFinally;

    bool isCoroutine = funcInfo->byteCodeFunction->IsCoroutine();

    if (isCoroutine)
    {
        regException = funcInfo->AcquireTmpRegister();
        regOffset = funcInfo->AcquireTmpRegister();
    }

    // Grab registers for the enumerator and for the current enumerated item.
    // The enumerator register will be released after this call returns.
    Js::RegSlot nextMethodReg = funcInfo->AcquireTmpRegister();
    loopNode->itemLocation = funcInfo->AcquireTmpRegister();

    // We want call profile information on the @@iterator call, so instead of adding a GetForOfIterator bytecode op
    // to do all the following work in a helper do it explicitly in bytecode so that the @@iterator call is exposed
    // to the profiler and JIT.

    byteCodeGenerator->SetHasFinally(true);
    byteCodeGenerator->SetHasTry(true);
    byteCodeGenerator->TopFuncInfo()->byteCodeFunction->SetDontInline(true);

    // do a ToObject on the collection
    Js::RegSlot tmpObj = funcInfo->AcquireTmpRegister();
    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Conv_Obj, tmpObj, loopNode->pnodeObj->location);

    if (isForAwaitOf)
        EmitGetAsyncIterator(loopNode->location, tmpObj, byteCodeGenerator, funcInfo);
    else
        EmitGetIterator(loopNode->location, tmpObj, byteCodeGenerator, funcInfo);

    funcInfo->ReleaseTmpRegister(tmpObj);

    EmitGetObjectMethod(
        nextMethodReg,
        loopNode->location,
        Js::PropertyIds::next,
        byteCodeGenerator,
        funcInfo);

    // The whole loop is surrounded with try..catch..finally - in order to capture the abrupt completion.
    Js::ByteCodeLabel finallyLabel = byteCodeGenerator->Writer()->DefineLabel();
    Js::ByteCodeLabel catchLabel = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->RecordCrossFrameEntryExitRecord(true);

    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse, shouldCallReturnFunctionLocation);
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse, shouldCallReturnFunctionLocationFinally);

    if (isCoroutine)
    {
        byteCodeGenerator->Writer()->BrReg2(Js::OpCode::TryFinallyWithYield, finallyLabel, regException, regOffset);
        byteCodeGenerator->PushJumpCleanupForTry(
            Js::OpCode::TryFinallyWithYield,
            finallyLabel,
            regException,
            regOffset);
    }
    else
    {
        byteCodeGenerator->Writer()->Br(Js::OpCode::TryFinally, finallyLabel);
        byteCodeGenerator->PushJumpCleanupForTry(Js::OpCode::TryFinally, finallyLabel);
    }

    byteCodeGenerator->Writer()->Br(Js::OpCode::TryCatch, catchLabel);
    byteCodeGenerator->PushJumpCleanupForTry(Js::OpCode::TryCatch, catchLabel);

    byteCodeGenerator->EndStatement(loopNode);

    // Need to increment loop count whether we are going into profile or not for HasLoop()
    uint loopId = byteCodeGenerator->Writer()->EnterLoop(loopEntrance);
    byteCodeGenerator->PushJumpCleanupForLoop(loopNode, loopId);

    byteCodeGenerator->StartStatement(loopNode->pnodeLval);

    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse, shouldCallReturnFunctionLocation);
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse, shouldCallReturnFunctionLocationFinally);

    // Call next on the iterator
    EmitFunctionCall(
        loopNode->itemLocation,
        nextMethodReg,
        loopNode->location,
        byteCodeGenerator,
        funcInfo);

    // If this is a for-await-of then await the iterator next result
    if (isForAwaitOf)
        EmitAwait(loopNode->itemLocation, loopNode->itemLocation, byteCodeGenerator, funcInfo);

    EmitThrowOnNotObject(loopNode->itemLocation, byteCodeGenerator);

    Js::RegSlot doneLocation = funcInfo->AcquireTmpRegister();
    EmitGetObjectProperty(
        doneLocation,
        loopNode->itemLocation,
        Js::PropertyIds::done,
        byteCodeGenerator,
        funcInfo);

    // Branch past loop if the result's done property is truthy
    byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, continuePastLoop, doneLocation);
    funcInfo->ReleaseTmpRegister(doneLocation);

    // Otherwise put result's value property in itemLocation
    EmitGetObjectProperty(
        loopNode->itemLocation,
        loopNode->itemLocation,
        Js::PropertyIds::value,
        byteCodeGenerator,
        funcInfo);

    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue, shouldCallReturnFunctionLocation);
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue, shouldCallReturnFunctionLocationFinally);

    EmitForInOfLoopBody(loopNode, loopEntrance, continuePastLoop, byteCodeGenerator, funcInfo, fReturnValue);

    byteCodeGenerator->PopJumpCleanup();
    byteCodeGenerator->Writer()->ExitLoop(loopId);
    funcInfo->ReleaseTmpRegister(nextMethodReg);

    EmitIteratorCatchAndFinally(catchLabel,
        finallyLabel,
        loopNode->location,
        shouldCallReturnFunctionLocation,
        shouldCallReturnFunctionLocationFinally,
        regException,
        regOffset,
        byteCodeGenerator,
        funcInfo,
        isForAwaitOf);
}